

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

void Wln_RetMarkChanges_rec(Wln_Ret_t *p,int iObj)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  Wln_Ntk_t *pWVar5;
  long lVar6;
  long lVar7;
  
  if ((iObj < 0) || ((p->vPathDelays).nSize <= iObj)) {
LAB_00388fe1:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar3 = (p->vPathDelays).pArray;
  if (piVar3[(uint)iObj] < 0) {
    return;
  }
  piVar3[(uint)iObj] = -1;
  pWVar5 = p->pNtk;
  if (iObj < (pWVar5->vRefs).nSize) {
    lVar7 = 0;
    do {
      if ((pWVar5->vRefs).pArray[(uint)iObj] <= lVar7) {
        return;
      }
      uVar1 = (p->vFanouts).nSize;
      if ((int)uVar1 <= iObj) break;
      piVar3 = (p->vFanouts).pArray;
      lVar6 = (long)piVar3[(uint)iObj];
      if ((lVar6 < 0) || (uVar1 <= (uint)piVar3[(uint)iObj])) goto LAB_00388fe1;
      iVar2 = piVar3[lVar6 + lVar7 * 2 + 1];
      if (((long)iVar2 < 0) || ((p->vFanins).nSize <= iVar2)) goto LAB_00388fe1;
      piVar4 = (p->vFanins).pArray;
      if (piVar4 == (int *)0x0) {
        return;
      }
      if ((piVar3[lVar6 + lVar7 * 2] != 0) && (piVar4[iVar2] == 0)) {
        Wln_RetMarkChanges_rec(p,piVar3[lVar6 + lVar7 * 2]);
        pWVar5 = p->pNtk;
      }
      lVar7 = lVar7 + 1;
    } while (iObj < (pWVar5->vRefs).nSize);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Wln_RetMarkChanges_rec( Wln_Ret_t * p, int iObj )
{
    int k, iFanout, * pLink, * pDelay = Vec_IntEntryP( &p->vPathDelays, iObj );
    if ( *pDelay < 0 )
        return;
    *pDelay = -1;
    Wln_RetForEachFanout( p, iObj, iFanout, pLink, k )
        if ( !pLink[0] )
            Wln_RetMarkChanges_rec( p, iFanout );
}